

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> PVar1;
  double dVar2;
  pointer pMVar3;
  pointer pFVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined4 in_register_00000034;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  Index j;
  ulong uVar15;
  long lVar16;
  double *pdVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Mat p;
  Mat sol;
  ArrayZZ sum_invRp;
  undefined1 local_118 [16];
  long local_108;
  undefined1 local_f8 [16];
  Index local_e8;
  ulong local_d8;
  double local_d0;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_c8;
  double *local_a8;
  double local_a0;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_98;
  pointer local_80;
  XprType local_78;
  
  local_118 = (undefined1  [16])0x0;
  local_108 = 0;
  lVar12 = (long)this->M;
  lVar11 = (long)this->nInvSolFound;
  if ((lVar11 != 0 && lVar12 != 0) &&
     (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar6 / SEXT816(lVar11),0) < lVar12)) {
    puVar10 = (undefined8 *)
              __cxa_allocate_exception
                        (8,CONCAT44(in_register_00000034,newSol1),SUB168(auVar6 % SEXT816(lVar11),0)
                        );
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_118,lVar11 * lVar12,lVar12,lVar11);
  local_f8 = (undefined1  [16])0x0;
  local_e8 = 0;
  lVar11 = (long)this->nInvSolFound;
  if ((lVar11 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar11),0) < 1)) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_f8,lVar11,1,lVar11);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_c8,(long)this->nInvSolFound,&this->zeroZZ,(allocator_type *)&local_80);
  auVar24 = _DAT_001680b0;
  auVar6 = _DAT_001680a0;
  uVar9 = this->nInvSolFound - 1;
  if (1 < this->nInvSolFound) {
    pMVar3 = (this->invPredictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = local_f8._8_8_ + -1;
    auVar18._8_4_ = (int)lVar11;
    auVar18._0_8_ = lVar11;
    auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
    pdVar13 = (double *)(local_f8._0_8_ + 8);
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_001680b0;
    do {
      if (0 < (long)local_f8._8_8_) {
        PVar1.m_storage.m_data.array[0] =
             pMVar3[uVar14].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
        uVar15 = 0;
        auVar23 = auVar6;
        do {
          auVar25 = auVar23 ^ auVar24;
          if ((bool)(~(auVar18._4_4_ < auVar25._4_4_ ||
                      auVar18._0_4_ < auVar25._0_4_ && auVar25._4_4_ == auVar18._4_4_) & 1)) {
            pdVar13[uVar15 - 1] = (double)PVar1.m_storage.m_data.array[0];
          }
          if (auVar25._12_4_ <= auVar18._12_4_ &&
              (auVar25._8_4_ <= auVar18._8_4_ || auVar25._12_4_ != auVar18._12_4_)) {
            pdVar13[uVar15] = (double)PVar1.m_storage.m_data.array[0];
          }
          uVar15 = uVar15 + 2;
          lVar11 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar11 + 2;
        } while ((local_f8._8_8_ + 1 & 0xfffffffffffffffe) != uVar15);
      }
      uVar14 = uVar14 + 1;
      pdVar13 = pdVar13 + local_f8._8_8_;
    } while (uVar14 != uVar9);
  }
  auVar6 = _DAT_001680b0;
  if (0 < (long)local_f8._8_8_) {
    pFVar4 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    PVar1.m_storage.m_data.array[0] =
         pFVar4[newSol1].super_LinearExpert<1,_1>.pred_z.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
    uVar14 = local_f8._8_8_ + 1 & 0xfffffffffffffffe;
    lVar11 = local_f8._8_8_ + -1;
    auVar25._8_4_ = (int)lVar11;
    auVar25._0_8_ = lVar11;
    auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar15 = 0;
    auVar25 = auVar25 ^ _DAT_001680b0;
    auVar24 = _DAT_001680a0;
    do {
      auVar18 = auVar24 ^ auVar6;
      iVar19 = auVar25._4_4_;
      iVar20 = auVar25._12_4_;
      if ((bool)(~(auVar18._4_4_ == iVar19 && auVar25._0_4_ < auVar18._0_4_ ||
                  iVar19 < auVar18._4_4_) & 1)) {
        *(DenseStorage<double,_1,_1,_1,_0> *)
         (local_f8._0_8_ + ((long)worseSol * local_f8._8_8_ + uVar15) * 8) =
             PVar1.m_storage.m_data.array[0];
      }
      if ((auVar18._12_4_ != iVar20 || auVar18._8_4_ <= auVar25._8_4_) && auVar18._12_4_ <= iVar20)
      {
        *(DenseStorage<double,_1,_1,_1,_0> *)
         (local_f8._0_8_ + ((long)worseSol * local_f8._8_8_ + uVar15 + 1) * 8) =
             PVar1.m_storage.m_data.array[0];
      }
      uVar15 = uVar15 + 2;
      lVar11 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar11 + 2;
    } while (uVar14 != uVar15);
    PVar1.m_storage.m_data.array[0] =
         pFVar4[newSol2].super_LinearExpert<1,_1>.pred_z.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
    lVar11 = local_f8._8_8_ * (long)(int)uVar9;
    uVar15 = 0;
    auVar22 = _DAT_001680a0;
    do {
      auVar24 = auVar22 ^ auVar6;
      if ((bool)(~(auVar24._4_4_ == iVar19 && auVar25._0_4_ < auVar24._0_4_ ||
                  iVar19 < auVar24._4_4_) & 1)) {
        *(DenseStorage<double,_1,_1,_1,_0> *)(local_f8._0_8_ + (lVar11 + uVar15) * 8) =
             PVar1.m_storage.m_data.array[0];
      }
      if ((auVar24._12_4_ != iVar20 || auVar24._8_4_ <= auVar25._8_4_) && auVar24._12_4_ <= iVar20)
      {
        *(DenseStorage<double,_1,_1,_1,_0> *)(local_f8._0_8_ + (lVar11 + uVar15 + 1) * 8) =
             PVar1.m_storage.m_data.array[0];
      }
      uVar15 = uVar15 + 2;
      lVar12 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar12 + 2;
    } while (uVar14 != uVar15);
  }
  if (0 < (this->param).iterMax) {
    uVar14 = 0;
    do {
      local_d8 = uVar14;
      if (0 < this->M) {
        lVar12 = 0;
        lVar11 = 0;
        do {
          uVar9 = this->nInvSolFound;
          if (0 < (int)uVar9) {
            lVar16 = 0;
            do {
              dVar21 = (double)(this->experts).
                               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               .
                               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar11].
                               super_LinearExpert<1,_1>.pred_z.
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                               m_storage - *(double *)(local_f8._0_8_ + local_f8._8_8_ * lVar16 * 8)
              ;
              dVar21 = exp(((double)(this->iInvRj).
                                    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                    .
                                    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                    m_storage * dVar21 * dVar21 * -0.5) / this->sumAll);
              *(double *)(local_118._0_8_ + (local_118._8_8_ * lVar16 + lVar11) * 8) = dVar21;
              lVar16 = lVar16 + 1;
              uVar9 = this->nInvSolFound;
            } while (lVar16 < (int)uVar9);
          }
          if (local_108 != 0) {
            dVar21 = *(double *)(local_118._0_8_ + lVar11 * 8);
            if (1 < local_108) {
              lVar16 = local_108 + -1;
              pdVar13 = (double *)(lVar12 + local_118._8_8_ * 8 + local_118._0_8_);
              do {
                dVar21 = dVar21 + *pdVar13;
                pdVar13 = pdVar13 + local_118._8_8_;
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
            }
            if (0 < local_108 && 0.0 < dVar21) {
              pdVar13 = (double *)(local_118._0_8_ + lVar12);
              lVar16 = local_108;
              do {
                *pdVar13 = *pdVar13 / dVar21;
                pdVar13 = pdVar13 + local_118._8_8_;
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
            }
          }
          if (0 < (int)uVar9) {
            pMVar3 = (this->iInvRj).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar13 = (double *)(local_118._0_8_ + lVar12);
            uVar14 = 0;
            do {
              local_c8.
              super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14].
              super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
                   = *pdVar13 *
                     (double)pMVar3[lVar11].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage
                     + local_c8.
                       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
                       .array[0];
              uVar14 = uVar14 + 1;
              pdVar13 = pdVar13 + local_118._8_8_;
            } while (uVar9 != uVar14);
          }
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar11 < this->M);
      }
      if (0 < this->nInvSolFound) {
        lVar11 = 0;
        do {
          local_78.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_data = (PointerType)(local_118._0_8_ + local_118._8_8_ * lVar11 * 8);
          local_80 = local_c8.
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar11;
          uVar7 = local_f8._0_8_;
          uVar8 = local_f8._8_8_;
          local_78.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value = local_118._8_8_;
          local_78.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startRow.m_value = 0;
          local_78.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_outerStride = local_118._8_8_;
          local_a8 = &local_a0;
          local_a0 = 1.0 / (local_80->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                           m_storage.m_data.array[0];
          local_78.m_lhs = &this->invRzj;
          local_78.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
               (XprTypeNested)local_118;
          local_78.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startCol.m_value = lVar11;
          Eigen::internal::
          product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          ::product_evaluator(&local_98,&local_78);
          local_d0 = *local_a8 *
                     *(double *)
                      local_98.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      .m_d.data;
          free(local_98.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
          *(double *)(uVar7 + uVar8 * lVar11 * 8) = local_d0;
          local_c8.
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar11].
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
               0.0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->nInvSolFound);
      }
      uVar9 = (int)local_d8 + 1;
      uVar14 = (ulong)uVar9;
    } while ((int)uVar9 < (this->param).iterMax);
  }
  if (0 < this->M) {
    piVar5 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    pdVar13 = (double *)(local_118._0_8_ + local_118._8_8_ * 8);
    do {
      iVar19 = -(uint)(local_108 == 0);
      if (1 < local_108) {
        lVar16 = 1;
        lVar12 = 0;
        pdVar17 = pdVar13;
        dVar21 = *(double *)(local_118._0_8_ + lVar11 * 8);
        do {
          dVar2 = *pdVar17;
          if (dVar21 < dVar2) {
            lVar12 = lVar16;
          }
          iVar19 = (int)lVar12;
          if (dVar2 <= dVar21) {
            dVar2 = dVar21;
          }
          lVar16 = lVar16 + 1;
          pdVar17 = pdVar17 + local_118._8_8_;
          dVar21 = dVar2;
        } while (local_108 != lVar16);
      }
      piVar5[lVar11] = iVar19;
      lVar11 = lVar11 + 1;
      pdVar13 = pdVar13 + 1;
    } while (lVar11 < this->M);
  }
  if (local_c8.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_c8.
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  free((void *)local_f8._0_8_);
  free((void *)local_118._0_8_);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}